

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O3

void __thiscall
webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::WebSocket
          (WebSocket<webfront::networking::TCPNetworkingTS> *this,Socket *netSocket)

{
  FrameDecoder *pFVar1;
  Header *pHVar2;
  value_type *__val;
  pointer pbVar3;
  mutable_buffer local_28;
  completion_handler_type local_18;
  
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .service_ = (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
              super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
              .service_;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.protocol_.family_ = 2;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.socket_ =
       (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.super_base_implementation_type.socket_;
  (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.socket_ = -1;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.state_ =
       (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.super_base_implementation_type.state_;
  (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.state_ = '\0';
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.reactor_data_ =
       (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.super_base_implementation_type.reactor_data_;
  (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.reactor_data_ = (per_descriptor_data)0x0;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.protocol_.family_ =
       (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.protocol_.family_;
  (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.protocol_.family_ = 2;
  (this->decoder).payloadBuffer.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decoder).payloadBuffer.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decoder).payloadBuffer.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar3 = (pointer)operator_new(0xe);
  (this->decoder).payloadBuffer.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = pbVar3;
  (this->decoder).payloadBuffer.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pbVar3 + 0xe;
  pbVar3[6] = 0;
  pbVar3[7] = 0;
  pbVar3[8] = 0;
  pbVar3[9] = 0;
  pbVar3[10] = 0;
  pbVar3[0xb] = 0;
  pbVar3[0xc] = 0;
  pbVar3[0xd] = 0;
  pbVar3[0] = 0;
  pbVar3[1] = 0;
  pbVar3[2] = 0;
  pbVar3[3] = 0;
  pbVar3[4] = 0;
  pbVar3[5] = 0;
  pbVar3[6] = 0;
  pbVar3[7] = 0;
  pHVar2 = &(this->decoder).headerBuffer;
  (pHVar2->raw)._M_elems[6] = 0;
  (pHVar2->raw)._M_elems[7] = 0;
  (pHVar2->raw)._M_elems[8] = 0;
  (pHVar2->raw)._M_elems[9] = 0;
  (pHVar2->raw)._M_elems[10] = 0;
  (pHVar2->raw)._M_elems[0xb] = 0;
  (pHVar2->raw)._M_elems[0xc] = 0;
  (pHVar2->raw)._M_elems[0xd] = 0;
  pFVar1 = &this->decoder;
  (pFVar1->headerBuffer).raw._M_elems[0] = 0;
  (pFVar1->headerBuffer).raw._M_elems[1] = 0;
  (pFVar1->headerBuffer).raw._M_elems[2] = 0;
  (pFVar1->headerBuffer).raw._M_elems[3] = 0;
  (pFVar1->headerBuffer).raw._M_elems[4] = 0;
  (pFVar1->headerBuffer).raw._M_elems[5] = 0;
  (pFVar1->headerBuffer).raw._M_elems[6] = 0;
  (pFVar1->headerBuffer).raw._M_elems[7] = 0;
  (this->decoder).maskIndex = '\0';
  (this->decoder).headerBufferParser = 0;
  (this->decoder).payloadBuffer.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = pbVar3;
  (this->decoder).state = starting;
  *(undefined8 *)&(this->textHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->textHandler).super__Function_base._M_functor + 8) = 0;
  (this->textHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->textHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->binaryHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->binaryHandler).super__Function_base._M_functor + 8) = 0;
  (this->binaryHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->binaryHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->closeHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->closeHandler).super__Function_base._M_functor + 8) = 0;
  (this->closeHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->closeHandler)._M_invoker = (_Invoker_type)0x0;
  this->started = false;
  local_28.data_ = &PTR_s__workspace_llm4binary_github_lic_001985f0;
  if (log::logTypeEnabled._4_1_ == '\x01') {
    log::anon_unknown_4::log(0.0);
  }
  this->started = true;
  local_28.data_ = &this->readBuffer;
  local_28.size_ = 0x2000;
  local_18.this = this;
  std::experimental::net::v1::detail::reactive_socket_service_base::
  async_receive<std::experimental::net::v1::mutable_buffer,webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::read()::_lambda(std::error_code,unsigned_long)_1_>
            (&((this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
               super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
              .service_)->super_reactive_socket_service_base,
             &(this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
              super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
              .implementation_.super_base_implementation_type,&local_28,0,&local_18);
  return;
}

Assistant:

explicit WebSocket(typename Net::Socket netSocket) : socket(std::move(netSocket)), started(false) {
        log::debug("WebSocket constructor");
        start();
    }